

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O0

void __thiscall BloomFilter::BloomFilter(BloomFilter *this,SkipList *memTable)

{
  bool bVar1;
  uint64_t *key;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [24];
  uint hash [4];
  ConstIterator local_20;
  ConstIterator i;
  SkipList *memTable_local;
  BloomFilter *this_local;
  
  i.p = (Node *)memTable;
  std::bitset<81920UL>::bitset(&this->bits);
  local_20 = SkipList::constBegin(i.p);
  while( true ) {
    bVar1 = SkipList::ConstIterator::hasNext(&local_20);
    if (!bVar1) break;
    SkipList::ConstIterator::next(&local_20);
    memset(local_48 + 0x10,0,0x10);
    key = SkipList::ConstIterator::key(&local_20);
    MurmurHash3_x64_128(key,8,1,local_48 + 0x10);
    std::bitset<81920UL>::operator[]((bitset<81920UL> *)local_48,(size_t)this);
    std::bitset<81920UL>::reference::operator=((reference *)local_48,true);
    std::bitset<81920UL>::reference::~reference((reference *)local_48);
    std::bitset<81920UL>::operator[]((bitset<81920UL> *)local_58,(size_t)this);
    std::bitset<81920UL>::reference::operator=((reference *)local_58,true);
    std::bitset<81920UL>::reference::~reference((reference *)local_58);
    std::bitset<81920UL>::operator[]((bitset<81920UL> *)local_68,(size_t)this);
    std::bitset<81920UL>::reference::operator=((reference *)local_68,true);
    std::bitset<81920UL>::reference::~reference((reference *)local_68);
    std::bitset<81920UL>::operator[]((bitset<81920UL> *)local_78,(size_t)this);
    std::bitset<81920UL>::reference::operator=((reference *)local_78,true);
    std::bitset<81920UL>::reference::~reference((reference *)local_78);
  }
  return;
}

Assistant:

BloomFilter::BloomFilter(const SkipList &memTable) {
  auto i = memTable.constBegin();
  while (i.hasNext()) {
    i.next();
    unsigned int hash[4] = {0};
    MurmurHash3_x64_128(&i.key(), sizeof(i.key()), 1, &hash);
    bits[hash[0] % (10240 * 8)] = true;
    bits[hash[1] % (10240 * 8)] = true;
    bits[hash[2] % (10240 * 8)] = true;
    bits[hash[3] % (10240 * 8)] = true;
  }
}